

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  int64_t *piVar1;
  long lVar2;
  int64_t *piVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  uint uVar10;
  rar *rar;
  short *psVar11;
  uint uVar12;
  uint uVar13;
  short sVar14;
  undefined4 uVar15;
  int iVar16;
  wchar_t wVar17;
  int iVar18;
  archive_string_conv *paVar19;
  short *psVar20;
  uint *puVar21;
  time_t tVar22;
  ulong uVar23;
  void *pvVar24;
  char *pcVar25;
  size_t sVar26;
  archive_string_conv *paVar27;
  data_block_offsets *pdVar28;
  archive_string_conv *paVar29;
  int *piVar30;
  byte bVar31;
  uint uVar32;
  mode_t mVar33;
  char *pcVar34;
  char cVar35;
  size_t __n;
  uint uVar36;
  size_t sVar37;
  long lVar38;
  byte bVar39;
  char cVar40;
  uint uVar41;
  uint uVar42;
  char *endp;
  char cVar43;
  ulong uVar44;
  bool bVar45;
  uint p0;
  char *local_98;
  ulong local_78;
  
  rar = (rar *)a->format->data;
  paVar19 = rar->opt_sconv;
  if (paVar19 == (archive_string_conv *)0x0) {
    if (rar->init_default_conversion == 0) {
      paVar19 = archive_string_default_conversion_for_read((archive_conflict *)a);
      rar->sconv_default = paVar19;
      rar->init_default_conversion = 1;
    }
    paVar19 = rar->sconv_default;
  }
  psVar20 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (psVar20 == (short *)0x0) {
    return -0x1e;
  }
  sVar9 = *psVar20;
  uVar8 = *(ushort *)((long)psVar20 + 5);
  uVar44 = (ulong)uVar8;
  rar->file_flags = (uint)*(ushort *)((long)psVar20 + 3);
  if (uVar8 < 0x20) {
    pcVar34 = "Invalid header size";
  }
  else {
    uVar15 = crc32(0,psVar20 + 1,5);
    __archive_read_consume(a,7);
    if ((rar->file_flags & 0x10) == 0) {
      rar->compression_method = '\0';
      rar->packed_size = 0;
      rar->unp_size = 0;
      rar->mtime = 0;
      rar->mnsec = 0;
      rar->mode = 0;
      rar->salt[0] = '\0';
      rar->salt[1] = '\0';
      rar->salt[2] = '\0';
      rar->salt[3] = '\0';
      rar->salt[4] = '\0';
      rar->salt[5] = '\0';
      rar->salt[6] = '\0';
      rar->salt[7] = '\0';
      rar->atime = 0;
      rar->ansec = 0;
      rar->ctime = 0;
      rar->cnsec = 0;
      rar->arctime = 0;
      rar->arcnsec = 0;
      puVar21 = (uint *)__archive_read_ahead(a,uVar44 - 7,(ssize_t *)0x0);
      if (puVar21 == (uint *)0x0) {
        return -0x1e;
      }
      sVar14 = crc32(uVar15,puVar21,uVar44 - 7 & 0xffffffff);
      if (sVar9 == sVar14) {
        uVar32 = *puVar21;
        uVar42 = puVar21[1];
        uVar23 = (ulong)uVar42;
        uVar12 = puVar21[2];
        bVar39 = *(byte *)((long)puVar21 + 0x13);
        uVar41 = puVar21[5];
        bVar4 = *(byte *)((long)puVar21 + 0x15);
        bVar5 = *(byte *)((long)puVar21 + 0x16);
        bVar6 = *(byte *)((long)puVar21 + 0x17);
        uVar13 = puVar21[6];
        iVar16 = *(int *)((long)puVar21 + 0xd);
        uVar10 = *(uint *)((long)puVar21 + 9);
        rar->compression_method = *(char *)((long)puVar21 + 0x12);
        tVar22 = get_time(iVar16);
        rar->mtime = tVar22;
        rar->file_crc = (ulong)uVar10;
        if ((rar->file_flags & 4) != 0) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          rar->has_encrypted_entries = 1;
          archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
        }
        piVar1 = &rar->packed_size;
        if ((rar->file_flags & 0x100) == 0) {
          pcVar34 = (char *)((long)puVar21 + 0x19);
          *piVar1 = (ulong)uVar32;
LAB_00247806:
          rar->unp_size = uVar23;
          lVar38 = rar->packed_size;
          if ((lVar38 < 0) || ((long)uVar23 < 0)) {
            pcVar34 = "Invalid sizes specified.";
          }
          else {
            lVar2 = uVar44 + (long)puVar21;
            rar->bytes_remaining = lVar38;
            uVar23 = uVar44;
            if (head_type == 'z') {
              uVar23 = lVar38 + uVar44;
              pvVar24 = __archive_read_ahead(a,(lVar38 + uVar44) - 7,(ssize_t *)0x0);
              pcVar34 = (char *)(((long)pcVar34 - (long)puVar21) + (long)pvVar24);
              lVar2 = (long)pvVar24 + uVar23;
              if (pvVar24 == (void *)0x0) {
                return -0x1e;
              }
            }
            endp = (char *)(lVar2 + -7);
            __n = (ulong)(byte)uVar41 * 0x100 + (ulong)bVar39;
            local_98 = pcVar34 + __n;
            if (local_98 <= endp) {
              uVar32 = (uint)__n;
              uVar44 = (ulong)(uVar32 * 2 + 2);
              if (rar->filename_allocated < uVar44) {
                pcVar25 = (char *)realloc(rar->filename,uVar44);
                if (pcVar25 != (char *)0x0) {
                  rar->filename = pcVar25;
                  rar->filename_allocated = uVar44;
                  goto LAB_002478e9;
                }
                goto LAB_00247a62;
              }
LAB_002478e9:
              psVar20 = (short *)rar->filename;
              memcpy(psVar20,pcVar34,__n);
              *(undefined1 *)((long)psVar20 + __n) = 0;
              if ((rar->file_flags & 0x200) == 0) {
                while (pcVar34 = strchr((char *)psVar20,0x5c), paVar27 = paVar19,
                      pcVar34 != (char *)0x0) {
                  *pcVar34 = '/';
                }
              }
              else {
                sVar26 = strlen((char *)psVar20);
                if (sVar26 == __n) {
                  if (rar->sconv_utf8 == (archive_string_conv *)0x0) {
                    paVar27 = archive_string_conversion_from_charset
                                        ((archive_conflict *)a,"UTF-8",L'\x01');
                    rar->sconv_utf8 = paVar27;
                    if (paVar27 == (archive_string_conv *)0x0) {
                      return -0x1e;
                    }
                  }
                  paVar27 = rar->sconv_utf8;
                  while (pcVar34 = strchr((char *)psVar20,0x5c), pcVar34 != (char *)0x0) {
                    *pcVar34 = '/';
                  }
                }
                else {
                  uVar42 = (int)sVar26 + 1;
                  sVar37 = 0;
                  if (uVar42 < uVar32) {
                    cVar43 = pcVar34[uVar42];
                    uVar42 = (int)sVar26 + 2;
                  }
                  else {
                    cVar43 = '\0';
                  }
                  uVar10 = uVar32 * 2;
                  if (uVar42 < uVar32) {
                    bVar45 = __n != 0;
                    bVar39 = 0;
                    bVar31 = 0;
                    sVar37 = 0;
LAB_00247ac6:
                    sVar26 = (size_t)uVar42;
LAB_00247ac9:
                    uVar41 = (uint)sVar26;
                    if (bVar31 == 0) {
                      uVar41 = uVar41 + 1;
                      bVar39 = pcVar34[sVar26];
                      bVar31 = 8;
                    }
                    bVar31 = bVar31 - 2;
                    uVar36 = (uint)sVar37;
                    switch(bVar39 >> (bVar31 & 0x1f) & 3) {
                    case 0:
                      if (uVar32 <= uVar41) {
LAB_00247b10:
                        sVar26 = (size_t)uVar41;
                        goto LAB_00247b13;
                      }
                      *(undefined1 *)((long)psVar20 + sVar37) = 0;
                      break;
                    case 1:
                      if (uVar32 <= uVar41) goto LAB_00247b10;
                      *(char *)((long)psVar20 + sVar37) = cVar43;
                      break;
                    case 2:
                      sVar26 = __n;
                      if (uVar32 - 1 <= uVar41) goto LAB_00247b13;
                      *(char *)((long)psVar20 + sVar37) = pcVar34[(ulong)uVar41 + 1];
                      sVar37 = (size_t)(uVar36 + 2);
                      *(char *)((long)psVar20 + (long)(int)uVar36 + 1) = pcVar34[uVar41];
                      uVar42 = uVar41 + 2;
                      goto LAB_00247c47;
                    case 3:
                      uVar42 = uVar41;
                      if (uVar32 <= uVar41) goto LAB_00247c47;
                      bVar7 = pcVar34[uVar41];
                      local_78 = (ulong)uVar41 + 1;
                      uVar42 = (uint)local_78;
                      if ((char)bVar7 < '\0') {
                        if (uVar32 <= uVar42) goto LAB_00247c47;
                        cVar40 = pcVar34[local_78];
                        local_78 = (ulong)(uVar41 + 2);
                        cVar35 = cVar43;
                      }
                      else {
                        cVar40 = '\0';
                        cVar35 = '\0';
                      }
                      if (uVar10 <= uVar36) goto LAB_00247c30;
                      uVar44 = (ulong)(int)uVar36;
                      lVar38 = 0;
                      goto LAB_00247c02;
                    }
                    uVar42 = uVar41 + 1;
                    sVar37 = (size_t)(uVar36 + 2);
                    *(char *)((long)psVar20 + (long)(int)uVar36 + 1) = pcVar34[uVar41];
                    goto LAB_00247c47;
                  }
LAB_00247c64:
                  if (uVar10 < (uint)sVar37) {
                    paVar27 = (archive_string_conv *)0x54;
                    archive_set_error(&a->archive,0x54,"Invalid filename");
                    __n = sVar37;
LAB_00247c86:
                    bVar45 = false;
                  }
                  else {
                    __n = (size_t)((uint)sVar37 + 1);
                    *(undefined2 *)((long)psVar20 + sVar37) = 0;
                    if (rar->sconv_utf16be == (archive_string_conv *)0x0) {
                      paVar27 = (archive_string_conv *)0x2a20a5;
                      paVar29 = archive_string_conversion_from_charset
                                          ((archive_conflict *)a,"UTF-16BE",L'\x01');
                      rar->sconv_utf16be = paVar29;
                      if (paVar29 == (archive_string_conv *)0x0) goto LAB_00247c86;
                    }
                    paVar27 = rar->sconv_utf16be;
                    sVar9 = *psVar20;
                    psVar11 = psVar20;
                    while (sVar9 != 0) {
                      if (*psVar11 == 0x5c00) {
                        *(undefined1 *)((long)psVar11 + 1) = 0x2f;
                      }
                      sVar9 = psVar11[1];
                      psVar11 = psVar11 + 1;
                    }
                    pcVar34 = pcVar34 + uVar42;
                    bVar45 = true;
                  }
                  local_98 = pcVar34;
                  if (!bVar45) {
                    return -0x1e;
                  }
                }
              }
              pcVar34 = rar->filename_save;
              if (((pcVar34 != (char *)0x0) && (rar->filename_save_size == __n)) &&
                 (iVar16 = bcmp(rar->filename,pcVar34,(ulong)((int)__n + 1)), iVar16 == 0)) {
                __archive_read_consume(a,uVar23 - 7);
                uVar32 = rar->cursor + 1;
                rar->cursor = uVar32;
                if (rar->nodes <= uVar32) {
                  pdVar28 = (data_block_offsets *)realloc(rar->dbo,(ulong)(rar->nodes + 1) * 0x18);
                  if (pdVar28 == (data_block_offsets *)0x0) {
                    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                    return -0x1e;
                  }
                  rar->dbo = pdVar28;
                  rar->nodes = rar->nodes + 1;
                  uVar32 = rar->cursor;
                  pdVar28[uVar32].header_size = uVar23;
                  piVar3 = &pdVar28[uVar32].start_offset;
                  *(undefined4 *)piVar3 = 0xffffffff;
                  *(undefined4 *)((long)piVar3 + 4) = 0xffffffff;
                  *(undefined4 *)(piVar3 + 1) = 0xffffffff;
                  *(undefined4 *)((long)piVar3 + 0xc) = 0xffffffff;
                }
                pdVar28 = rar->dbo;
                uVar32 = rar->cursor;
                if (-1 < pdVar28[uVar32].start_offset) {
                  return 0;
                }
                pdVar28[uVar32].start_offset = a->filter->position;
                pdVar28[uVar32].end_offset = *piVar1 + pdVar28[uVar32].start_offset;
                return 0;
              }
              if (rar->filename_must_match != '\0') {
                pcVar34 = "Mismatch of file parts split across multi-volume archive";
                goto LAB_00247768;
              }
              uVar44 = (ulong)((int)__n + 1);
              pcVar34 = (char *)realloc(pcVar34,uVar44);
              if (pcVar34 == (char *)0x0) {
LAB_00247a62:
                pcVar34 = "Couldn\'t allocate memory.";
              }
              else {
                rar->filename_save = pcVar34;
                memcpy(pcVar34,rar->filename,uVar44);
                rar->filename_save_size = __n;
                free(rar->dbo);
                pdVar28 = (data_block_offsets *)calloc(1,0x18);
                rar->dbo = pdVar28;
                if (pdVar28 == (data_block_offsets *)0x0) goto LAB_00247a62;
                pdVar28->header_size = uVar23;
                *(undefined4 *)&pdVar28->start_offset = 0xffffffff;
                *(undefined4 *)((long)&pdVar28->start_offset + 4) = 0xffffffff;
                *(undefined4 *)&pdVar28->end_offset = 0xffffffff;
                *(undefined4 *)((long)&pdVar28->end_offset + 4) = 0xffffffff;
                rar->cursor = 0;
                rar->nodes = 1;
                if ((rar->file_flags & 0x400) != 0) {
                  if (endp < local_98 + 8) goto LAB_002477a2;
                  *(undefined8 *)rar->salt = *(undefined8 *)local_98;
                  local_98 = local_98 + 8;
                }
                if (((rar->file_flags & 0x1000) != 0) &&
                   (iVar16 = read_exttime(local_98,rar,endp), iVar16 < 0)) {
                  pcVar34 = "Invalid header size";
                  goto LAB_00247768;
                }
                __archive_read_consume(a,uVar23 - 7);
                lVar38 = a->filter->position;
                pdVar28 = rar->dbo;
                pdVar28->start_offset = lVar38;
                pdVar28->end_offset = lVar38 + rar->packed_size;
                if ((byte)uVar12 - 3 < 3) {
                  mVar33 = (uint)bVar5 * 0x100 + (uint)bVar4 | (uint)bVar6 << 0x10 |
                           (uint)(byte)uVar13 << 0x18;
                }
                else {
                  if (2 < (byte)uVar12) {
                    pcVar34 = "Unknown file attributes from RAR file\'s host OS";
                    goto LAB_00247768;
                  }
                  uVar32 = 0x4049;
                  if ((bVar4 & 0x10) == 0) {
                    uVar32 = 0x8000;
                  }
                  rar->mode = uVar32;
                  mVar33 = uVar32 | 0x1a4;
                }
                rar->mode = mVar33;
                rar->bytes_unconsumed = 0;
                (rar->lzss).position = 0;
                rar->dictionary_size = 0;
                (rar->br).cache_avail = 0;
                (rar->br).avail_in = 0;
                rar->crc_calculated = 0;
                rar->entry_eof = '\0';
                rar->bytes_uncopied = 0;
                rar->offset = 0;
                rar->offset_outgoing = 0;
                rar->offset_seek = 0;
                rar->valid = '\x01';
                rar->is_ppmd_block = '\0';
                rar->start_new_table = '\x01';
                free(rar->unp_buffer);
                rar->unp_buffer = (uchar *)0x0;
                rar->unp_offset = 0;
                rar->unp_buffer_size = 0x20000;
                memset(rar->lengthtable,0,0x194);
                Ppmd7_Free(&rar->ppmd7_context);
                rar->ppmd_valid = '\0';
                rar->ppmd_eod = '\0';
                (rar->filters).filterstart = 0x7fffffffffffffff;
                if (head_type == 'z') {
                  return 0;
                }
                archive_entry_set_mtime(entry,rar->mtime,rar->mnsec);
                archive_entry_set_ctime(entry,rar->ctime,rar->cnsec);
                archive_entry_set_atime(entry,rar->atime,rar->ansec);
                archive_entry_set_size(entry,rar->unp_size);
                archive_entry_set_mode(entry,rar->mode);
                wVar17 = _archive_entry_copy_pathname_l(entry,(char *)psVar20,__n,paVar27);
                if (wVar17 == L'\0') {
                  iVar16 = 0;
LAB_00248082:
                  iVar18 = iVar16;
                  if ((rar->mode & 0xf000) == 0xa000) {
                    rar->bytes_remaining = 0;
                    archive_entry_set_size(entry,0);
                    iVar18 = read_symlink_stored(a,entry,paVar19);
                    if (iVar18 < -0x14) {
                      return iVar18;
                    }
                    if (iVar16 < iVar18) {
                      iVar18 = iVar16;
                    }
                  }
                  if (rar->bytes_remaining != 0) {
                    return iVar18;
                  }
                  rar->entry_eof = '\x01';
                  return iVar18;
                }
                piVar30 = __errno_location();
                if (*piVar30 != 0xc) {
                  pcVar34 = archive_string_conversion_charset_name(paVar27);
                  archive_set_error(&a->archive,0x54,
                                    "Pathname cannot be converted from %s to current locale.",
                                    pcVar34);
                  iVar16 = -0x14;
                  goto LAB_00248082;
                }
                pcVar34 = "Can\'t allocate memory for Pathname";
              }
              iVar16 = 0xc;
              goto LAB_0024776d;
            }
            pcVar34 = "Invalid filename size";
          }
        }
        else {
          if (0x27 < uVar8) {
            pcVar34 = (char *)((long)puVar21 + 0x21);
            uVar15 = *(undefined4 *)((long)puVar21 + 0x1d);
            *piVar1 = (ulong)(uVar32 & 0xff00) |
                      CONCAT44(*(undefined4 *)((long)puVar21 + 0x19),uVar32) & 0xffffffffffff0000 |
                      (ulong)uVar32 & 0xff;
            uVar23 = (ulong)(uVar42 & 0xff00) | CONCAT44(uVar15,uVar42) & 0xffffffffffff0000 |
                     uVar23 & 0xff;
            goto LAB_00247806;
          }
LAB_002477a2:
          pcVar34 = "Invalid header size";
        }
      }
      else {
        pcVar34 = "Header CRC error";
      }
    }
    else {
      pcVar34 = "RAR solid archive support unavailable.";
    }
  }
LAB_00247768:
  iVar16 = 0x54;
LAB_0024776d:
  archive_set_error(&a->archive,iVar16,pcVar34);
  return -0x1e;
  while (lVar38 = lVar38 + 1, uVar42 < uVar10) {
LAB_00247c02:
    *(char *)((long)psVar20 + lVar38 * 2 + uVar44) = cVar35;
    *(char *)((long)psVar20 + lVar38 * 2 + uVar44 + 1) =
         pcVar34[(int)(uVar44 >> 1) + (int)lVar38 & 0x7fffffff] + cVar40;
    uVar42 = (int)sVar37 + 2;
    sVar37 = (size_t)uVar42;
    if ((byte)((bVar7 & 0x7f) + 1) == (char)lVar38) break;
  }
LAB_00247c30:
  uVar42 = (uint)local_78;
LAB_00247c47:
  bVar45 = (uint)sVar37 < uVar10;
  if ((uVar32 <= uVar42) || (uVar10 <= (uint)sVar37)) goto LAB_00247c64;
  goto LAB_00247ac6;
LAB_00247b13:
  uVar42 = (uint)sVar26;
  if (!(bool)(uVar42 < uVar32 & bVar45)) goto LAB_00247c64;
  goto LAB_00247ac9;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  uint32_t crc32_computed, crc32_read;
  int ret = (ARCHIVE_OK), ret2;
  char *newptr;
  size_t newsize;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_computed = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_computed = crc32(crc32_computed, h, (unsigned)(header_size - 7));
  crc32_read = archive_le16dec(rar_header.crc);
  if ((crc32_computed & 0xffff) != crc32_read) {
#ifndef DONT_FAIL_ON_CRC_ERROR
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
#endif
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = offset >= end ? 0 : *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            if (offset >= end)
              continue;
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            if (offset >= end)
              continue;
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            if (offset >= end - 1) {
              offset = end;
              continue;
            }
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length;

            if (offset >= end)
              continue;

            length = *(p + offset++);
            if (length & 0x80) {
              if (offset >= end)
                continue;
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      struct data_block_offsets *newdbo;

      newsize = sizeof(*rar->dbo) * (rar->nodes + 1);
      if ((newdbo = realloc(rar->dbo, newsize)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo = newdbo;
      rar->nodes++;
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }
  else if (rar->filename_must_match)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Mismatch of file parts split across multi-volume archive");
    return (ARCHIVE_FATAL);
  }

  newsize = filename_size + 1;
  if ((newptr = realloc(rar->filename_save, newsize)) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->filename_save = newptr;
  memcpy(rar->filename_save, rar->filename, newsize);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;
  rar->filters.filterstart = INT64_MAX;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}